

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

uint32_t unicode_get_short_code(uint32_t c)

{
  uint32_t c_local;
  uint local_4;
  
  local_4 = c;
  if (0x7f < c) {
    if (c < 0xd0) {
      local_4 = c + 0x280;
    }
    else {
      local_4 = (uint)unicode_get_short_code::unicode_short_table[c - 0xd0];
    }
  }
  return local_4;
}

Assistant:

static uint32_t unicode_get_short_code(uint32_t c)
{
    static const uint16_t unicode_short_table[2] = { 0x2044, 0x2215 };

    if (c < 0x80)
        return c;
    else if (c < 0x80 + 0x50)
        return c - 0x80 + 0x300;
    else
        return unicode_short_table[c - 0x80 - 0x50];
}